

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O0

IGUIFont * __thiscall
irr::gui::CGUIEnvironment::addFont(CGUIEnvironment *this,path *name,IGUIFont *font)

{
  s32 sVar1;
  SFont *pSVar2;
  IGUIFont *in_RDX;
  SFont *in_RDI;
  s32 index;
  SFont f;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar3;
  SFont *in_stack_ffffffffffffff98;
  array<irr::gui::CGUIEnvironment::SFont> *in_stack_ffffffffffffffa0;
  path *in_stack_ffffffffffffffa8;
  SNamedPath *in_stack_ffffffffffffffb0;
  IGUIFont *local_8;
  
  if (in_RDX != (IGUIFont *)0x0) {
    SFont::SFont((SFont *)0x3af0d2);
    irr::io::SNamedPath::setPath(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    sVar1 = core::array<irr::gui::CGUIEnvironment::SFont>::binary_search
                      (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (sVar1 == -1) {
      core::array<irr::gui::CGUIEnvironment::SFont>::push_back
                ((array<irr::gui::CGUIEnvironment::SFont> *)
                 CONCAT44(0xffffffff,in_stack_ffffffffffffff90),in_RDI);
      IReferenceCounted::grab
                ((IReferenceCounted *)
                 ((long)&in_RDX->_vptr_IGUIFont + (long)in_RDX->_vptr_IGUIFont[-3]));
    }
    else {
      pSVar2 = core::array<irr::gui::CGUIEnvironment::SFont>::operator[]
                         ((array<irr::gui::CGUIEnvironment::SFont> *)
                          CONCAT44(sVar1,in_stack_ffffffffffffff90),(u32)((ulong)in_RDI >> 0x20));
      local_8 = pSVar2->Font;
    }
    uVar3 = (uint)(sVar1 != -1);
    SFont::~SFont((SFont *)0x3af16a);
    if (uVar3 != 0) {
      return local_8;
    }
  }
  return in_RDX;
}

Assistant:

IGUIFont *CGUIEnvironment::addFont(const io::path &name, IGUIFont *font)
{
	if (font) {
		SFont f;
		f.NamedPath.setPath(name);
		s32 index = Fonts.binary_search(f);
		if (index != -1)
			return Fonts[index].Font;
		f.Font = font;
		Fonts.push_back(f);
		font->grab();
	}
	return font;
}